

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O3

void __thiscall
asmjit::_abi_1_10::RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::_logNode
          (RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder> *this,BaseNode *node,
          uint32_t indentation,char *action)

{
  StringTmp<512UL> *this_00;
  ulong uVar1;
  char *pcVar2;
  
  this_00 = &this->_sb;
  String::clear(&this_00->super_String);
  String::_opChars(&this_00->super_String,kAppend,' ',(ulong)indentation);
  if (action != (char *)0x0) {
    String::_opString(&this_00->super_String,kAppend,action,0xffffffffffffffff);
    String::_opChar(&this_00->super_String,kAppend,' ');
  }
  Formatter::formatNode
            (&this_00->super_String,&this->_formatOptions,&this->_cc->super_BaseBuilder,node);
  String::_opChar(&this_00->super_String,kAppend,'\n');
  uVar1 = (ulong)(this->_sb).super_String.field_0._type;
  if (uVar1 < 0x1f) {
    pcVar2 = (char *)((long)&(this->_sb).super_String.field_0 + 1);
  }
  else {
    uVar1 = (this->_sb).super_String.field_0._large.size;
    pcVar2 = (this->_sb).super_String.field_0._large.data;
  }
  (*this->_logger->_vptr_Logger[2])(this->_logger,pcVar2,uVar1);
  return;
}

Assistant:

void _logNode(BaseNode* node, uint32_t indentation, const char* action) noexcept {
    _sb.clear();
    _sb.appendChars(' ', indentation);
    if (action) {
      _sb.append(action);
      _sb.append(' ');
    }
    Formatter::formatNode(_sb, _formatOptions, cc(), node);
    _sb.append('\n');
    _logger->log(_sb);
  }